

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O2

void deqp::gles3::Functional::eval_length_vec2(ShaderEvalContext *c)

{
  Type_conflict TVar1;
  Vector<float,_2> local_10;
  
  local_10.m_data[1] = c->in[0].m_data[1];
  local_10.m_data[0] = c->in[0].m_data[3];
  TVar1 = tcu::length<float,2>(&local_10);
  (c->color).m_data[0] = TVar1;
  return;
}

Assistant:

void eval_cross_vec3 (ShaderEvalContext& c) { c.color.xyz()	= cross(c.in[0].swizzle(2, 0, 1), c.in[1].swizzle(1, 2, 0)); }